

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerivedModule.h
# Opt level: O2

ResultType __thiscall
Scine::Core::DerivedModule::detail::exec_if_impl<false>::
execute<boost::mpl::m_iter<boost::mpl::map<boost::mpl::pair<Scine::Core::DummyInterface,boost::mpl::vector<sample_namespace::DummyModelA,sample_namespace::DummyModelB,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,2l,3l>,boost::mpl::m_iter<boost::mpl::map<boost::mpl::pair<Scine::Core::DummyInterface,boost::mpl::vector<sample_namespace::DummyModelA,sample_namespace::DummyModelB,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,3l,3l>,Scine::Core::DerivedModule::detail::MapPairInterfaceIdentifierMatches,Scine::Core::DerivedModule::detail::ResolveModel>
          (exec_if_impl<false> *this,
          m_iter<boost::mpl::map<boost::mpl::pair<Scine::Core::DummyInterface,_boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_2L,_3L>
          *param_1,m_iter<boost::mpl::map<boost::mpl::pair<Scine::Core::DummyInterface,_boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_3L,_3L>
                   *param_2,MapPairInterfaceIdentifierMatches *p,ResolveModel *e)

{
  bool bVar1;
  
  bVar1 = MapPairInterfaceIdentifierMatches::operator()
                    (p,(pair<Scine::Core::DummyInterface,_boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>
                        *)0x0);
  if (bVar1) {
    ResolveModel::operator()
              ((ResolveModel *)this,
               (pair<Scine::Core::DummyInterface,_boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>
                *)e);
  }
  else {
    *(undefined8 *)this = 0;
  }
  return (ResultType)(placeholder *)this;
}

Assistant:

static auto execute(Iter* /* i */, LastIter* /* l */, const Pred& p, const Exec& e) -> typename Exec::ResultType {
    using Item = typename boost::mpl::deref<Iter>::type;

    if (!p(static_cast<Item*>(0))) {
      using Next = typename boost::mpl::next<Iter>::type;
      return exec_if_impl<boost::is_same<Next, LastIter>::value>::execute(static_cast<Next*>(0),
                                                                          static_cast<LastIter*>(0), p, e);
    }

    return e(static_cast<Item*>(0));
  }